

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

uint Vec_MemHashKey(Vec_Mem_t *p,word *pEntry)

{
  uint uVar1;
  uint local_2c;
  uint uHash;
  uint *pData;
  int nData;
  int i;
  word *pEntry_local;
  Vec_Mem_t *p_local;
  
  local_2c = 0;
  for (pData._4_4_ = 0; (int)pData._4_4_ < p->nEntrySize << 1; pData._4_4_ = pData._4_4_ + 1) {
    local_2c = *(int *)((long)pEntry + (long)(int)pData._4_4_ * 4) *
               Vec_MemHashKey::s_Primes[(int)(pData._4_4_ & 7)] + local_2c;
  }
  uVar1 = Vec_IntSize(p->vTable);
  return local_2c % uVar1;
}

Assistant:

static inline unsigned Vec_MemHashKey( Vec_Mem_t * p, word * pEntry )
{
    static int s_Primes[8] = { 1699, 4177, 5147, 5647, 6343, 7103, 7873, 8147 };
    int i, nData = 2 * p->nEntrySize;
    unsigned * pData = (unsigned *)pEntry;
    unsigned uHash = 0;
    for ( i = 0; i < nData; i++ )
        uHash += pData[i] * s_Primes[i & 0x7];
    return uHash % Vec_IntSize(p->vTable);
}